

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O0

ImVec2 CalcNextScrollFromScrollTargetAndClamp(ImGuiWindow *window,bool snap_on_edges)

{
  long in_RDI;
  float fVar1;
  float target_y;
  float cr_y;
  float decoration_up_height;
  float target_x;
  float cr_x;
  ImGuiContext *g;
  ImVec2 scroll;
  ImVec2 *this;
  float in_stack_ffffffffffffffb8;
  float in_stack_ffffffffffffffbc;
  float in_stack_ffffffffffffffc0;
  undefined4 in_stack_ffffffffffffffc4;
  ImVec2 local_8;
  
  if (*(float *)(in_RDI + 0x98) <= 3.4028235e+38 && *(float *)(in_RDI + 0x98) != 3.4028235e+38) {
    in_stack_ffffffffffffffb8 =
         ImGuiWindow::TitleBarHeight
                   ((ImGuiWindow *)CONCAT44(in_stack_ffffffffffffffc4,in_stack_ffffffffffffffc0));
    ImGuiWindow::MenuBarHeight
              ((ImGuiWindow *)CONCAT44(in_stack_ffffffffffffffc4,in_stack_ffffffffffffffc0));
  }
  this = (ImVec2 *)&stack0xffffffffffffffbc;
  ImVec2::ImVec2(this,0.0,0.0);
  local_8 = ImMax((ImVec2 *)CONCAT44(in_stack_ffffffffffffffbc,in_stack_ffffffffffffffb8),this);
  if (((*(byte *)(in_RDI + 0xb2) & 1) == 0) && ((*(byte *)(in_RDI + 0xb4) & 1) == 0)) {
    fVar1 = ImMin<float>(local_8.x,*(float *)(in_RDI + 0x8c));
    local_8.y = ImMin<float>(local_8.y,*(float *)(in_RDI + 0x90));
    local_8.x = fVar1;
  }
  return local_8;
}

Assistant:

static ImVec2 CalcNextScrollFromScrollTargetAndClamp(ImGuiWindow* window, bool snap_on_edges)
{
    ImGuiContext& g = *GImGui;
    ImVec2 scroll = window->Scroll;
    if (window->ScrollTarget.x < FLT_MAX)
    {
        float cr_x = window->ScrollTargetCenterRatio.x;
        float target_x = window->ScrollTarget.x;
        if (snap_on_edges && cr_x <= 0.0f && target_x <= window->WindowPadding.x)
            target_x = 0.0f;
        else if (snap_on_edges && cr_x >= 1.0f && target_x >= window->ContentSize.x + window->WindowPadding.x + g.Style.ItemSpacing.x)
            target_x = window->ContentSize.x + window->WindowPadding.x * 2.0f;
        scroll.x = target_x - cr_x * (window->SizeFull.x - window->ScrollbarSizes.x);
    }
    if (window->ScrollTarget.y < FLT_MAX)
    {
        // 'snap_on_edges' allows for a discontinuity at the edge of scrolling limits to take account of WindowPadding so that scrolling to make the last item visible scroll far enough to see the padding.
        float decoration_up_height = window->TitleBarHeight() + window->MenuBarHeight();
        float cr_y = window->ScrollTargetCenterRatio.y;
        float target_y = window->ScrollTarget.y;
        if (snap_on_edges && cr_y <= 0.0f && target_y <= window->WindowPadding.y)
            target_y = 0.0f;
        if (snap_on_edges && cr_y >= 1.0f && target_y >= window->ContentSize.y + window->WindowPadding.y + g.Style.ItemSpacing.y)
            target_y = window->ContentSize.y + window->WindowPadding.y * 2.0f;
        scroll.y = target_y - cr_y * (window->SizeFull.y - window->ScrollbarSizes.y - decoration_up_height);
    }
    scroll = ImMax(scroll, ImVec2(0.0f, 0.0f));
    if (!window->Collapsed && !window->SkipItems)
    {
        scroll.x = ImMin(scroll.x, window->ScrollMax.x);
        scroll.y = ImMin(scroll.y, window->ScrollMax.y);
    }
    return scroll;
}